

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfstrmatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::Clone
          (TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  TPZStructMatrix *pTVar1;
  TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *in_RDI;
  TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xc0);
  TPZFStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZFStructMatrix<TVar,TPar>::Clone(){
    return new TPZFStructMatrix(*this);
}